

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedStrings::SerializeWithCachedSizes
          (TensorValue_RepeatedStrings *this,CodedOutputStream *output)

{
  int iVar1;
  int size;
  char *data;
  string *value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TensorValue_RepeatedStrings *this_local;
  
  local_20 = 0;
  iVar1 = values_size(this);
  for (; local_20 < iVar1; local_20 = local_20 + 1) {
    values_abi_cxx11_(this,local_20);
    data = (char *)std::__cxx11::string::data();
    values_abi_cxx11_(this,local_20);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values"
              );
    value = values_abi_cxx11_(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteString(1,value,output);
  }
  return;
}

Assistant:

void TensorValue_RepeatedStrings::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string values = 1;
  for (int i = 0, n = this->values_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->values(i).data(), this->values(i).length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.TensorValue.RepeatedStrings.values");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->values(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MILSpec.TensorValue.RepeatedStrings)
}